

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O3

int32 fread_retry(void *pointer,int32 size,int32 num_items,FILE *stream)

{
  size_t sVar1;
  int iVar2;
  size_t __n;
  int iVar3;
  
  sVar1 = fread(pointer,(long)size,(long)num_items,(FILE *)stream);
  __n = (long)num_items - sVar1;
  if (__n != 0) {
    iVar2 = 0x3c;
    iVar3 = 0;
    do {
      if (iVar2 == 0x3c) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                       ,0x1b3,"fread() failed; retrying...\n");
      }
      else if (iVar2 == 0) {
        return -1;
      }
      iVar2 = iVar2 + -1;
      iVar3 = iVar3 + size * (int)sVar1;
      sleep(1);
      sVar1 = fread((void *)((long)iVar3 + (long)pointer),(long)size,__n,(FILE *)stream);
      __n = __n - sVar1;
    } while (__n != 0);
  }
  return num_items;
}

Assistant:

int32
fread_retry(void *pointer, int32 size, int32 num_items, FILE * stream)
{
    char *data;
    size_t n_items_read;
    size_t n_items_rem;
    uint32 n_retry_rem;
    int32 loc;

    n_retry_rem = FREAD_RETRY_COUNT;

    data = (char *)pointer;
    loc = 0;
    n_items_rem = num_items;

    do {
        n_items_read = fread(&data[loc], size, n_items_rem, stream);

        n_items_rem -= n_items_read;

        if (n_items_rem > 0) {
            /* an incomplete read occurred */

            if (n_retry_rem == 0)
                return -1;

            if (n_retry_rem == FREAD_RETRY_COUNT) {
                E_ERROR_SYSTEM("fread() failed; retrying...\n");
            }

            --n_retry_rem;

            loc += n_items_read * size;
#if !defined(_WIN32) && defined(HAVE_UNISTD_H)
            sleep(1);
#endif
        }
    } while (n_items_rem > 0);

    return num_items;
}